

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_ASAi_bnd.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 uVar2;
  UserData data_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int ncheck;
  int retval;
  N_Vector uB;
  sunrealtype abstolB;
  sunrealtype reltolB;
  int indexB;
  N_Vector u;
  sunrealtype t;
  sunrealtype abstol;
  sunrealtype reltol;
  sunrealtype dy;
  sunrealtype dx;
  SUNLinearSolver LSB;
  SUNLinearSolver LS;
  SUNMatrix AB;
  SUNMatrix A;
  void *cvode_mem;
  UserData data;
  SUNContext sunctx;
  int in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  void *pvVar7;
  undefined4 local_7c;
  N_Vector in_stack_ffffffffffffff90;
  UserData data_01;
  N_Vector uB_00;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18 [2];
  int local_4;
  
  local_4 = 0;
  local_20 = (undefined8 *)0x0;
  local_28 = 0;
  pvVar7 = (void *)0x0;
  local_20 = (undefined8 *)malloc(0x28);
  iVar1 = check_retval(pvVar7,(char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c);
  if (iVar1 == 0) {
    *local_20 = 0x3fa8f9c18f9c18fa;
    local_20[1] = 0x3fa8618618618618;
    local_20[2] = 0x407a440000000000;
    local_20[3] = 0x402ec00000000000;
    local_20[4] = 0x407b900000000001;
    uB_00 = (N_Vector)0x0;
    data_01 = (UserData)&DAT_3ee4f8b588e368f1;
    uVar2 = SUNContext_Create(0,local_18);
    iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff5c);
    if (iVar1 == 0) {
      data_00 = (UserData)N_VNew_Serial(800,local_18[0]);
      iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c);
      if (iVar1 == 0) {
        SetIC(in_stack_ffffffffffffff90,data_00);
        printf("\nCreate and allocate CVODES memory for forward runs\n");
        local_28 = CVodeCreate(2,local_18[0]);
        iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff5c);
        if (iVar1 == 0) {
          uVar2 = CVodeSetUserData(local_28,local_20);
          iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                               in_stack_ffffffffffffff5c);
          if (iVar1 == 0) {
            uVar2 = CVodeInit(0,local_28,f,data_00);
            iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff5c);
            if (iVar1 == 0) {
              uVar2 = CVodeSStolerances(uB_00,data_01,local_28);
              iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                                   in_stack_ffffffffffffff5c);
              if (iVar1 == 0) {
                uVar3 = SUNBandMatrix(800,0x14,0x14,local_18[0]);
                iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                                     in_stack_ffffffffffffff5c);
                if (iVar1 == 0) {
                  uVar4 = SUNLinSol_Band(data_00,uVar3,local_18[0]);
                  iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                                       in_stack_ffffffffffffff5c);
                  if (iVar1 == 0) {
                    uVar2 = CVodeSetLinearSolver(local_28,uVar4,uVar3);
                    iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                                         in_stack_ffffffffffffff5c);
                    if (iVar1 == 0) {
                      uVar2 = CVodeSetJacFn(local_28,Jac);
                      iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                                           in_stack_ffffffffffffff5c);
                      if (iVar1 == 0) {
                        printf("\nAllocate global memory\n");
                        uVar2 = CVodeAdjInit(local_28,0x32,1);
                        iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,in_stack_ffffffffffffff60
                                                                    ),in_stack_ffffffffffffff5c);
                        if (iVar1 == 0) {
                          printf("\nForward integration\n");
                          uVar2 = CVodeF(0x3ff0000000000000,local_28,data_00,
                                         &stack0xffffffffffffff90,1,&stack0xffffffffffffff60);
                          iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                               in_stack_ffffffffffffff5c);
                          if (iVar1 == 0) {
                            printf("\nncheck = %d\n",(ulong)in_stack_ffffffffffffff60);
                            pvVar7 = (void *)N_VNew_Serial(800,local_18[0]);
                            iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                 in_stack_ffffffffffffff5c);
                            if (iVar1 == 0) {
                              N_VConst(0,pvVar7);
                              printf("\nCreate and allocate CVODES memory for backward run\n");
                              uVar2 = CVodeCreateB(local_28,2,&local_7c);
                              iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                              if (iVar1 == 0) {
                                uVar2 = CVodeSetUserDataB(local_28,local_7c,local_20);
                                iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                if (iVar1 == 0) {
                                  uVar2 = CVodeInitB(0x3ff0000000000000,local_28,local_7c,fB,pvVar7)
                                  ;
                                  iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                  if (iVar1 == 0) {
                                    uVar2 = CVodeSStolerancesB(0x3eb0c6f7a0b5ed8d,
                                                               &DAT_3ee4f8b588e368f1,local_28,
                                                               local_7c);
                                    iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                    if (iVar1 == 0) {
                                      uVar5 = SUNBandMatrix(800,0x14,0x14,local_18[0]);
                                      iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                      if (iVar1 == 0) {
                                        uVar6 = SUNLinSol_Band(pvVar7,uVar5,local_18[0]);
                                        iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                        if (iVar1 == 0) {
                                          uVar2 = CVodeSetLinearSolverB
                                                            (local_28,local_7c,uVar6,uVar5);
                                          iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                          if (iVar1 == 0) {
                                            uVar2 = CVodeSetJacFnB(local_28,local_7c,JacB);
                                            iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                            if (iVar1 == 0) {
                                              printf("\nBackward integration\n");
                                              uVar2 = CVodeB(0,local_28,1);
                                              iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                              if (iVar1 == 0) {
                                                uVar2 = CVodeGetB(local_28,local_7c,
                                                                  &stack0xffffffffffffff90,pvVar7);
                                                iVar1 = check_retval(pvVar7,(char *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff60),
                                                  in_stack_ffffffffffffff5c);
                                                if (iVar1 == 0) {
                                                  PrintOutput(uB_00,data_01);
                                                  N_VDestroy(data_00);
                                                  N_VDestroy(pvVar7);
                                                  CVodeFree(&local_28);
                                                  SUNLinSolFree(uVar4);
                                                  SUNMatDestroy(uVar3);
                                                  SUNLinSolFree(uVar6);
                                                  SUNMatDestroy(uVar5);
                                                  free(local_20);
                                                  SUNContext_Free(local_18);
                                                  local_4 = 0;
                                                }
                                                else {
                                                  local_4 = 1;
                                                }
                                              }
                                              else {
                                                local_4 = 1;
                                              }
                                            }
                                            else {
                                              local_4 = 1;
                                            }
                                          }
                                          else {
                                            local_4 = 1;
                                          }
                                        }
                                        else {
                                          local_4 = 1;
                                        }
                                      }
                                      else {
                                        local_4 = 1;
                                      }
                                    }
                                    else {
                                      local_4 = 1;
                                    }
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  void* cvode_mem;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;

  sunrealtype dx, dy, reltol, abstol, t;
  N_Vector u;

  int indexB;

  sunrealtype reltolB, abstolB;
  N_Vector uB;

  int retval, ncheck;

  data      = NULL;
  cvode_mem = NULL;
  u = uB = NULL;
  LS = LSB = NULL;
  A = AB = NULL;

  /* Allocate and initialize user data memory */

  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  dx = data->dx = XMAX / (MX + 1);
  dy = data->dy = YMAX / (MY + 1);
  data->hdcoef  = ONE / (dx * dx);
  data->hacoef  = SUN_RCONST(1.5) / (TWO * dx);
  data->vdcoef  = ONE / (dy * dy);

  /* Set the tolerances for the forward integration */
  reltol = ZERO;
  abstol = ATOL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate u vector */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew", 0)) { return (1); }

  /* Initialize u vector */
  SetIC(u, data);

  /* Create and allocate CVODES memory for forward run */

  printf("\nCreate and allocate CVODES memory for forward runs\n");

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for the forward problem */
  A = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Band(u, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine for the forward problem */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Allocate global memory */

  printf("\nAllocate global memory\n");

  retval = CVodeAdjInit(cvode_mem, NSTEP, CV_HERMITE);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("\nForward integration\n");
  retval = CVodeF(cvode_mem, TOUT, u, &t, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("\nncheck = %d\n", ncheck);

  /* Set the tolerances for the backward integration */
  reltolB = RTOLB;
  abstolB = ATOL;

  /* Allocate uB */
  uB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)uB, "N_VNew", 0)) { return (1); }
  /* Initialize uB = 0 */
  N_VConst(ZERO, uB);

  /* Create and allocate CVODES memory for backward run */

  printf("\nCreate and allocate CVODES memory for backward run\n");

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeInitB(cvode_mem, indexB, fB, TOUT, uB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  /* Create banded SUNMatrix for the backward problem */
  AB = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval((void*)AB, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the backward problem */
  LSB = SUNLinSol_Band(uB, AB, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, AB);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine for the backward problem */
  retval = CVodeSetJacFnB(cvode_mem, indexB, JacB);
  if (check_retval(&retval, "CVodeSetJacFnB", 1)) { return (1); }

  /* Perform backward integration */
  printf("\nBackward integration\n");
  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &t, uB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  PrintOutput(uB, data);

  N_VDestroy(u);            /* Free the u vector                      */
  N_VDestroy(uB);           /* Free the uB vector                     */
  CVodeFree(&cvode_mem);    /* Free the CVODE problem memory          */
  SUNLinSolFree(LS);        /* Free the forward linear solver memory  */
  SUNMatDestroy(A);         /* Free the forward matrix memory         */
  SUNLinSolFree(LSB);       /* Free the backward linear solver memory */
  SUNMatDestroy(AB);        /* Free the backward matrix memory        */
  free(data);               /* Free the user data */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS simulation context */

  return (0);
}